

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayer.cpp
# Opt level: O1

vector_type * __thiscall
nanoNet::NeuralNetworkLayer::predict
          (vector_type *__return_storage_ptr__,NeuralNetworkLayer *this,vector_type *inputData)

{
  size_t sVar1;
  size_t sVar2;
  pointer pvVar3;
  pointer pfVar4;
  pointer pfVar5;
  long lVar6;
  float *pfVar7;
  vector_type *__range1;
  size_t sVar8;
  size_t sVar9;
  float *value;
  float *pfVar10;
  float fVar11;
  
  std::vector<float,_std::allocator<float>_>::vector(__return_storage_ptr__,&this->m_biases);
  sVar1 = this->m_outputCount;
  if (sVar1 != 0) {
    sVar2 = this->m_inputCount;
    pvVar3 = (this->m_weights).
             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pfVar4 = (inputData->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pfVar5 = (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    sVar8 = 0;
    do {
      if (sVar2 != 0) {
        lVar6 = *(long *)&pvVar3[sVar8].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data;
        fVar11 = pfVar5[sVar8];
        sVar9 = 0;
        do {
          fVar11 = fVar11 + *(float *)(lVar6 + sVar9 * 4) * pfVar4[sVar9];
          pfVar5[sVar8] = fVar11;
          sVar9 = sVar9 + 1;
        } while (sVar2 != sVar9);
      }
      sVar8 = sVar8 + 1;
    } while (sVar8 != sVar1);
  }
  pfVar10 = (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pfVar7 = (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pfVar10 != pfVar7) {
    do {
      fVar11 = ActivationFunction::operator()(&this->m_activationFunction,*pfVar10);
      *pfVar10 = fVar11;
      pfVar10 = pfVar10 + 1;
    } while (pfVar10 != pfVar7);
  }
  return __return_storage_ptr__;
}

Assistant:

NeuralNetworkLayer::vector_type NeuralNetworkLayer::predict(const vector_type& inputData) const
{
    vector_type result(m_biases);

    for (std::size_t i = 0; i < m_outputCount; i++)
        for (std::size_t j = 0; j < m_inputCount; j++)
            result[i] += m_weights[i][j] * inputData[j];

    for (auto& value : result)
        value = m_activationFunction(value);

    return result;
}